

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertySpecification.cpp
# Opt level: O0

bool __thiscall
Rml::PropertySpecification::ParsePropertyDeclaration
          (PropertySpecification *this,PropertyDictionary *dictionary,PropertyId property_id,
          String *property_value)

{
  pointer this_00;
  bool bVar1;
  reference value;
  undefined1 local_b0 [8];
  Property new_property;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50 [8];
  StringList property_values;
  PropertyDefinition *property_definition;
  String *property_value_local;
  PropertyId property_id_local;
  PropertyDictionary *dictionary_local;
  PropertySpecification *this_local;
  
  property_values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)GetProperty(this,property_id);
  if ((PropertyDefinition *)
      property_values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage == (PropertyDefinition *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(local_50);
    ParsePropertyValues(this,(StringList *)local_50,property_value,None);
    bVar1 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(local_50);
    if (bVar1) {
      this_local._7_1_ = false;
      new_property.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._0_4_ = 1;
    }
    else {
      Property::Property((Property *)local_b0);
      this_00 = property_values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      value = ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](local_50,0);
      this_local._7_1_ =
           PropertyDefinition::ParseValue((PropertyDefinition *)this_00,(Property *)local_b0,value);
      if (this_local._7_1_) {
        PropertyDictionary::SetProperty(dictionary,property_id,(Property *)local_b0);
      }
      new_property.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._0_4_ = 1;
      Property::~Property((Property *)local_b0);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_50);
  }
  return this_local._7_1_;
}

Assistant:

bool PropertySpecification::ParsePropertyDeclaration(PropertyDictionary& dictionary, PropertyId property_id, const String& property_value) const
{
	// Parse as a single property.
	const PropertyDefinition* property_definition = GetProperty(property_id);
	if (!property_definition)
		return false;

	StringList property_values;
	ParsePropertyValues(property_values, property_value, SplitOption::None);
	if (property_values.empty())
		return false;

	Property new_property;
	if (!property_definition->ParseValue(new_property, property_values[0]))
		return false;

	dictionary.SetProperty(property_id, new_property);
	return true;
}